

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

string * __thiscall
t_javame_generator::get_cap_name
          (string *__return_storage_ptr__,t_javame_generator *this,string *name)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  string *name_local;
  t_javame_generator *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
  iVar1 = toupper((int)*pcVar2);
  puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)name);
  *puVar3 = (char)iVar1;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  return __return_storage_ptr__;
}

Assistant:

std::string t_javame_generator::get_cap_name(std::string name) {
  name[0] = toupper(name[0]);
  return name;
}